

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

void * __thiscall
Fossilize::StateRecorder::Impl::copy_pnext_struct
          (Impl *this,VkPipelineColorWriteCreateInfoEXT *create_info,ScratchAllocator *alloc,
          DynamicStateInfo *dynamic_state_info)

{
  VkPipelineColorWriteCreateInfoEXT *pVVar1;
  uint *puVar2;
  
  pVVar1 = copy<VkPipelineColorWriteCreateInfoEXT>(this,create_info,1,alloc);
  if ((dynamic_state_info == (DynamicStateInfo *)0x0) ||
     (dynamic_state_info->color_write_enable != false)) {
    pVVar1->pColorWriteEnables = (VkBool32 *)0x0;
  }
  else {
    puVar2 = copy<unsigned_int>(this,pVVar1->pColorWriteEnables,(ulong)pVVar1->attachmentCount,alloc
                               );
    pVVar1->pColorWriteEnables = puVar2;
  }
  return pVVar1;
}

Assistant:

void *StateRecorder::Impl::copy_pnext_struct(const VkPipelineColorWriteCreateInfoEXT *create_info,
                                             ScratchAllocator &alloc,
                                             const DynamicStateInfo *dynamic_state_info)
{
	auto *color_write = copy(create_info, 1, alloc);
	if (dynamic_state_info && !dynamic_state_info->color_write_enable)
		color_write->pColorWriteEnables = copy(color_write->pColorWriteEnables, color_write->attachmentCount, alloc);
	else
		color_write->pColorWriteEnables = nullptr;
	return color_write;
}